

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::MultiReporter::sectionStarting(MultiReporter *this,SectionInfo *sectionInfo)

{
  pointer puVar1;
  IEventListener *pIVar2;
  unique_ptr<Catch::IEventListener> *reporterish;
  pointer this_00;
  
  puVar1 = (this->m_reporterLikes).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->m_reporterLikes).
                 super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar1; this_00 = this_00 + 1
      ) {
    pIVar2 = Detail::unique_ptr<Catch::IEventListener>::operator->(this_00);
    (*pIVar2->_vptr_IEventListener[7])(pIVar2,sectionInfo);
  }
  return;
}

Assistant:

void MultiReporter::sectionStarting( SectionInfo const& sectionInfo ) {
        for ( auto& reporterish : m_reporterLikes ) {
            reporterish->sectionStarting( sectionInfo );
        }
    }